

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImgList<unsigned_int> * __thiscall
cimg_library::CImgList<unsigned_int>::insert
          (CImgList<unsigned_int> *this,CImg<unsigned_int> *img,uint pos,bool is_shared)

{
  CImg<unsigned_int> *pCVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  ulong *puVar7;
  CImg<unsigned_int> *pCVar8;
  CImgArgumentException *this_00;
  long lVar9;
  ulong uVar10;
  CImg<unsigned_int> *pCVar11;
  ulong uVar12;
  uint uVar13;
  
  uVar13 = this->_width;
  if (pos == 0xffffffff) {
    pos = uVar13;
  }
  uVar12 = (ulong)pos;
  if (uVar13 < pos) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%p)] CImgList<%s>::insert(): Invalid insertion request of specified image (%u,%u,%u,%u,%p) at position %u."
               ,(ulong)this->_width,(ulong)this->_allocated_width,this->_data,"unsigned int",
               (ulong)img->_width,(ulong)img->_height,(ulong)img->_depth,(ulong)img->_spectrum,
               img->_data,uVar12);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  this->_width = uVar13 + 1;
  uVar3 = this->_allocated_width;
  if (uVar3 < uVar13 + 1) {
    uVar10 = 0x10;
    if (uVar3 != 0) {
      uVar10 = (ulong)(uVar3 * 2);
    }
    this->_allocated_width = (uint)uVar10;
    puVar7 = (ulong *)operator_new__(uVar10 * 0x20 + 8);
    *puVar7 = uVar10;
    if ((uint)uVar10 != 0) {
      lVar9 = 0;
      do {
        *(undefined8 *)((long)puVar7 + lVar9 + 0x20) = 0;
        puVar2 = (undefined8 *)((long)puVar7 + lVar9 + 8);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined1 *)((long)puVar7 + lVar9 + 0x18) = 0;
        lVar9 = lVar9 + 0x20;
      } while (uVar10 * 0x20 != lVar9);
    }
    pCVar11 = (CImg<unsigned_int> *)(puVar7 + 1);
    pCVar8 = this->_data;
    if (pCVar8 != (CImg<unsigned_int> *)0x0) {
      if (pos != 0) {
        memcpy(pCVar11,pCVar8,uVar12 << 5);
      }
      if (uVar13 - pos != 0) {
        memcpy(pCVar11 + (ulong)pos + 1,pCVar8 + pos,(ulong)(uVar13 - pos) << 5);
      }
      if ((is_shared) && (puVar4 = img->_data, puVar4 != (uint *)0x0)) {
        uVar12 = (ulong)pos;
        uVar3 = img->_height;
        uVar5 = img->_depth;
        uVar6 = img->_spectrum;
        pCVar1 = pCVar11 + uVar12;
        pCVar1->_width = img->_width;
        pCVar1->_height = uVar3;
        pCVar1->_depth = uVar5;
        pCVar1->_spectrum = uVar6;
        *(undefined1 *)(puVar7 + uVar12 * 4 + 3) = 1;
        puVar7[uVar12 * 4 + 4] = (ulong)puVar4;
      }
      else {
        uVar12 = (ulong)pos;
        puVar7[uVar12 * 4 + 4] = 0;
        pCVar8 = pCVar11 + uVar12;
        pCVar8->_width = 0;
        pCVar8->_height = 0;
        pCVar8->_depth = 0;
        pCVar8->_spectrum = 0;
        CImg<unsigned_int>::assign<unsigned_int>(pCVar11 + uVar12,img);
        pCVar8 = this->_data;
        uVar13 = this->_width - 1;
      }
      memset(pCVar8,0,(ulong)uVar13 << 5);
      pCVar8 = this->_data;
      if (pCVar8 != (CImg<unsigned_int> *)0x0) {
        if (pCVar8[-1]._data != (uint *)0x0) {
          lVar9 = (long)pCVar8[-1]._data << 5;
          do {
            CImg<unsigned_int>::~CImg((CImg<unsigned_int> *)((long)&pCVar8[-1]._width + lVar9));
            lVar9 = lVar9 + -0x20;
          } while (lVar9 != 0);
        }
        operator_delete__(&pCVar8[-1]._data);
      }
      this->_data = pCVar11;
      return this;
    }
  }
  else {
    pCVar11 = this->_data;
    if (pCVar11 != (CImg<unsigned_int> *)0x0) {
      if (uVar13 - pos != 0) {
        memmove(pCVar11 + uVar12 + 1,pCVar11 + uVar12,(ulong)(uVar13 - pos) << 5);
      }
      if (is_shared) {
        puVar4 = img->_data;
        pCVar8 = this->_data;
        if (puVar4 != (uint *)0x0) {
          uVar13 = img->_height;
          uVar3 = img->_depth;
          uVar5 = img->_spectrum;
          pCVar11 = pCVar8 + uVar12;
          pCVar11->_width = img->_width;
          pCVar11->_height = uVar13;
          pCVar11->_depth = uVar3;
          pCVar11->_spectrum = uVar5;
          pCVar8[uVar12]._is_shared = true;
          pCVar8[uVar12]._data = puVar4;
          return this;
        }
      }
      else {
        pCVar8 = this->_data;
      }
      pCVar8[uVar12]._data = (uint *)0x0;
      pCVar11 = pCVar8 + uVar12;
      pCVar8 = pCVar8 + uVar12;
      pCVar8->_width = 0;
      pCVar8->_height = 0;
      pCVar8->_depth = 0;
      pCVar8->_spectrum = 0;
      goto LAB_001a791b;
    }
    pCVar11 = (CImg<unsigned_int> *)0x0;
  }
  this->_data = pCVar11;
  if ((is_shared) && (puVar4 = img->_data, puVar4 != (uint *)0x0)) {
    uVar13 = img->_height;
    uVar3 = img->_depth;
    uVar5 = img->_spectrum;
    pCVar11->_width = img->_width;
    pCVar11->_height = uVar13;
    pCVar11->_depth = uVar3;
    pCVar11->_spectrum = uVar5;
    pCVar11->_is_shared = true;
    pCVar11->_data = puVar4;
    return this;
  }
LAB_001a791b:
  CImg<unsigned_int>::assign<unsigned_int>(pCVar11,img);
  return this;
}

Assistant:

CImgList<T>& insert(const CImg<T>& img, const unsigned int pos=~0U, const bool is_shared=false) {
      const unsigned int npos = pos==~0U?_width:pos;
      if (npos>_width)
        throw CImgArgumentException(_cimglist_instance
                                    "insert(): Invalid insertion request of specified image (%u,%u,%u,%u,%p) "
                                    "at position %u.",
                                    cimglist_instance,
                                    img._width,img._height,img._depth,img._spectrum,img._data,npos);
      CImg<T> *const new_data = (++_width>_allocated_width)?new CImg<T>[_allocated_width?(_allocated_width<<=1):
                                                                        (_allocated_width=16)]:0;
      if (!_data) { // Insert new element into empty list
        _data = new_data;
        if (is_shared && img) {
          _data->_width = img._width;
          _data->_height = img._height;
          _data->_depth = img._depth;
          _data->_spectrum = img._spectrum;
          _data->_is_shared = true;
          _data->_data = img._data;
        } else *_data = img;
      }
      else {
        if (new_data) { // Insert with re-allocation
          if (npos) std::memcpy((void*)new_data,(void*)_data,sizeof(CImg<T>)*npos);
          if (npos!=_width - 1)
            std::memcpy((void*)(new_data + npos + 1),(void*)(_data + npos),sizeof(CImg<T>)*(_width - 1 - npos));
          if (is_shared && img) {
            new_data[npos]._width = img._width;
            new_data[npos]._height = img._height;
            new_data[npos]._depth = img._depth;
            new_data[npos]._spectrum = img._spectrum;
            new_data[npos]._is_shared = true;
            new_data[npos]._data = img._data;
          } else {
            new_data[npos]._width = new_data[npos]._height = new_data[npos]._depth = new_data[npos]._spectrum = 0;
            new_data[npos]._data = 0;
            new_data[npos] = img;
          }
          std::memset((void*)_data,0,sizeof(CImg<T>)*(_width - 1));
          delete[] _data;
          _data = new_data;
        } else { // Insert without re-allocation
          if (npos!=_width - 1)
            std::memmove((void*)(_data + npos + 1),(void*)(_data + npos),sizeof(CImg<T>)*(_width - 1 - npos));
          if (is_shared && img) {
            _data[npos]._width = img._width;
            _data[npos]._height = img._height;
            _data[npos]._depth = img._depth;
            _data[npos]._spectrum = img._spectrum;
            _data[npos]._is_shared = true;
            _data[npos]._data = img._data;
          } else {
            _data[npos]._width = _data[npos]._height = _data[npos]._depth = _data[npos]._spectrum = 0;
            _data[npos]._data = 0;
            _data[npos] = img;
          }
        }
      }
      return *this;
    }